

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O3

void __thiscall
Nova::Boundary_Uniform<float,_1>::Fill_Ghost_Cells
          (Boundary_Uniform<float,_1> *this,T_Grid *grid,T_Arrays *u,T_Arrays *u_ghost,float dt,
          float time,int number_of_ghost_cells)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  ulong uVar4;
  bool bVar5;
  T_Index *index;
  Array<Nova::Range<int,_1>_> regions;
  undefined1 local_68 [8];
  pointer pRStack_60;
  Range<int,_1> local_58;
  T_STORAGE local_40;
  bool local_3c;
  T_Region local_34;
  
  local_34 = Whole_Region;
  Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
            ((Grid_Iterator_Cell<float,_1> *)local_68,grid,0,&local_34,0);
  if (local_3c == true) {
    do {
      pfVar3 = Array_ND<float,_1>::operator()(u,(Vector<int,_1,_true> *)&local_40);
      fVar1 = *pfVar3;
      pfVar3 = Array_ND<float,_1>::operator()(u_ghost,(Vector<int,_1,_true> *)&local_40);
      *pfVar3 = fVar1;
      if ((int)local_40._M_elems[0] < (int)local_58.max_corner._data._M_elems[0]) {
        local_40._M_elems[0] = (_Type)((int)local_40._M_elems[0] + 1);
      }
      else {
        Grid_Iterator<float,_1>::Next_Helper((Grid_Iterator<float,_1> *)local_68);
      }
    } while (local_3c != false);
  }
  local_68 = (undefined1  [8])0x0;
  pRStack_60 = (pointer)0x0;
  local_58.min_corner._data._M_elems[0] = (T_STORAGE)0x0;
  local_58.max_corner._data._M_elems[0] = (T_STORAGE)0x0;
  Find_Ghost_Regions(this,grid,(Array<Nova::Range<int,_1>_> *)local_68,number_of_ghost_cells);
  uVar4 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    if ((ulong)((long)pRStack_60 - (long)local_68 >> 3) <= uVar4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
    (*(this->super_Boundary<float,_1>)._vptr_Boundary[8])
              (dt,time,this,grid,u_ghost,uVar4,(T_INDEX *)local_68 + uVar4 * 2);
    uVar4 = 1;
    bVar2 = false;
  } while (bVar5);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68);
  }
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Ghost_Cells(const T_Grid& grid,const T_Arrays& u,T_Arrays& u_ghost,const T dt,const T time,const int number_of_ghost_cells)
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    for(Cell_Iterator iterator(grid);iterator.Valid();iterator.Next()){const T_Index& index=iterator.Cell_Index();
        u_ghost(index)=u(index);}
    Array<Range<int,d> > regions;
    Find_Ghost_Regions(grid,regions,number_of_ghost_cells);
    for(int side=0;side<T_Grid::number_of_faces_per_cell;++side) Fill_Single_Ghost_Region(grid,u_ghost,side,dt,time,regions(side));
}